

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perseus.h
# Opt level: O0

void __thiscall
Perseus::
PlanStartOfIteration<std::vector<std::vector<AlphaVector,std::allocator<AlphaVector>>,std::allocator<std::vector<AlphaVector,std::allocator<AlphaVector>>>>>
          (Perseus *this,int iter,vector<double,_std::allocator<double>_> *VB,
          vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          *V)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  size_t sVar6;
  string *filename;
  PlanningUnitDecPOMDPDiscrete *this_00;
  ostream *poVar7;
  vector<double,_std::allocator<double>_> *in_RDX;
  int in_ESI;
  Perseus *in_RDI;
  double dVar8;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar9 [16];
  undefined1 extraout_var [56];
  stringstream valueFunctionFilename;
  string resultsDir;
  JointBeliefInterface *jb0;
  uint i;
  double x;
  Perseus *in_stack_fffffffffffffc68;
  QFunctionsDiscrete *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  QFunctionsDiscrete *in_stack_fffffffffffffc88;
  BeliefInterface *in_stack_fffffffffffffc90;
  allocator<char> *in_stack_fffffffffffffca0;
  undefined1 includeBGindices;
  char *in_stack_fffffffffffffca8;
  PlanningUnit *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcb8;
  string local_280 [35];
  char local_25d;
  int local_25c;
  string local_258 [32];
  stringstream local_238 [16];
  ostream local_228 [383];
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [32];
  int local_68;
  string local_58 [32];
  JointBeliefInterface *local_38;
  uint local_2c;
  double local_28;
  vector<double,_std::allocator<double>_> *local_18;
  int local_c;
  undefined1 auVar10 [64];
  
  local_28 = 0.0;
  local_2c = 0;
  local_18 = in_RDX;
  local_c = in_ESI;
  while( true ) {
    uVar2 = (ulong)local_2c;
    sVar3 = std::vector<double,_std::allocator<double>_>::size(local_18);
    if (uVar2 == sVar3) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(ulong)local_2c);
    local_28 = *pvVar4 + local_28;
    local_2c = local_2c + 1;
  }
  AlphaVectorPlanning::GetPU((AlphaVectorPlanning *)in_stack_fffffffffffffc68);
  local_38 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD
                       ((PlanningUnitMADPDiscrete *)
                        CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  iVar1 = GetVerbose(in_RDI);
  if (-2 < iVar1) {
    GetIdentification_abi_cxx11_(in_stack_fffffffffffffc68);
    poVar5 = std::operator<<((ostream *)&std::cout,local_58);
    poVar5 = std::operator<<(poVar5,": iteration ");
    local_68 = (int)std::setw(6);
    poVar5 = std::operator<<(poVar5,(_Setw)local_68);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_c);
    poVar5 = std::operator<<(poVar5," |V| ");
    sVar6 = GetSize((Perseus *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                    in_stack_fffffffffffffc78);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
    auVar10._8_56_ = extraout_var;
    auVar10._0_8_ = extraout_XMM1_Qa;
    auVar9 = auVar10._0_16_;
    poVar5 = std::operator<<(poVar5," sumV/nrB ");
    dVar8 = local_28;
    sVar3 = std::vector<double,_std::allocator<double>_>::size(local_18);
    auVar9 = vcvtusi2sd_avx512f(auVar9,sVar3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar8 / auVar9._0_8_);
    poVar5 = std::operator<<(poVar5," V0 ");
    dVar8 = BeliefValue::GetValue(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar8);
    poVar5 = std::operator<<(poVar5," (best ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_RDI->_m_bestValue);
    poVar5 = std::operator<<(poVar5,")");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_58);
  }
  if (local_38 != (JointBeliefInterface *)0x0) {
    (**(code **)((long)*local_38 + 8))();
  }
  if (((in_RDI->_m_storeIntermediateValueFunctions & 1U) != 0) && ((in_RDI->_m_dryrun & 1U) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    AlphaVectorPlanning::GetPU((AlphaVectorPlanning *)in_stack_fffffffffffffc68);
    directories::MADPGetResultsDir(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_a9);
    std::__cxx11::stringstream::stringstream(local_238);
    poVar5 = std::operator<<(local_228,local_88);
    poVar5 = std::operator<<(poVar5,"/intermediate/");
    GetIdentification_abi_cxx11_(in_stack_fffffffffffffc68);
    filename = (string *)std::operator<<(poVar5,local_258);
    poVar5 = std::operator<<((ostream *)filename,"ValueFunction_h");
    this_00 = AlphaVectorPlanning::GetPU((AlphaVectorPlanning *)in_stack_fffffffffffffc68);
    sVar6 = PlanningUnit::GetHorizon((PlanningUnit *)this_00);
    includeBGindices = (undefined1)((ulong)this_00 >> 0x38);
    poVar7 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
    poVar7 = std::operator<<(poVar7,"_iter_");
    local_25c = (int)std::setw(4);
    poVar7 = std::operator<<(poVar7,(_Setw)local_25c);
    local_25d = (char)std::setfill<char>('0');
    poVar7 = std::operator<<(poVar7,local_25d);
    std::ostream::operator<<(poVar7,local_c);
    std::__cxx11::string::~string(local_258);
    std::__cxx11::stringstream::str();
    AlphaVectorPlanning::ExportValueFunction
              (filename,(QFunctionsDiscrete *)poVar5,(bool)includeBGindices);
    std::__cxx11::string::~string(local_280);
    std::__cxx11::stringstream::~stringstream(local_238);
    std::__cxx11::string::~string(local_88);
  }
  return;
}

Assistant:

void PlanStartOfIteration(int iter,
                              const std::vector<double> &VB,
                              const VF &V) const
        {
            double x=0;
            for(unsigned int i=0;i!=VB.size();i++)
                x+=VB[i];
            JointBeliefInterface* jb0 = GetPU()->GetNewJointBeliefFromISD();
            if(GetVerbose() >= -1)
                std::cout 
                    << GetIdentification() << ": iteration " << std::setw(6)
                    << iter 
                    << " |V| " << GetSize(V)
                    << " sumV/nrB " << x/VB.size() << " V0 " 
                    << BeliefValue::GetValue( *jb0, V)
                    << " (best " << _m_bestValue << ")" << std::endl;
            delete jb0;

            if(_m_storeIntermediateValueFunctions && !_m_dryrun)
            {
                std::string resultsDir=directories::MADPGetResultsDir("POMDP",
                                                                 GetPU());
                std::stringstream valueFunctionFilename;
                valueFunctionFilename << resultsDir << "/intermediate/"
                                      << GetIdentification()
                                      << "ValueFunction_h"
                                      << GetPU()->GetHorizon() << "_iter_" 
                                      << std::setw(4) << std::setfill('0')
                                      << iter;
                AlphaVectorPlanning::
                    ExportValueFunction(valueFunctionFilename.str(),V);
            }
        }